

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

void tlb_set_page_with_attrs_mipsel
               (CPUState *cpu,target_ulong_conflict vaddr,hwaddr paddr,MemTxAttrs attrs,int prot,
               int mmu_idx,target_ulong_conflict size)

{
  target_ulong_conflict *ptVar1;
  undefined8 *puVar2;
  long *plVar3;
  undefined8 *puVar4;
  CPUArchState_conflict8 *pCVar5;
  _func_int_CPUState_ptr_MemTxAttrs_conflict *p_Var6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  MemoryRegion_conflict *pMVar10;
  FlatView *pFVar11;
  MemoryListener *pMVar12;
  QTailQLink *pQVar13;
  QTailQLink *pQVar14;
  _Bool _Var15;
  int asidx;
  target_ulong_conflict tVar16;
  uint uVar17;
  uint uVar18;
  MemoryRegionSection *section;
  void *pvVar19;
  ram_addr_t rVar20;
  hwaddr hVar21;
  uint uVar22;
  ulong uVar23;
  target_ulong_conflict page;
  uc_struct_conflict5 *uc;
  uc_arch uVar24;
  long lVar25;
  uc_arch uVar26;
  MemTxAttrs in_stack_ffffffffffffff68;
  uc_arch local_90;
  int prot_local;
  hwaddr xlat;
  MemTxAttrs local_7c;
  long local_78;
  ulong local_70;
  long local_68;
  CPUArchState_conflict8 *local_60;
  uint *local_58;
  long local_50;
  target_ulong_conflict *local_48;
  ulong local_40;
  ulong local_38;
  
  pCVar5 = (CPUArchState_conflict8 *)cpu->env_ptr;
  p_Var6 = cpu->cc->asidx_from_attrs;
  prot_local = prot;
  if (p_Var6 == (_func_int_CPUState_ptr_MemTxAttrs_conflict *)0x0) {
    asidx = 0;
  }
  else {
    asidx = (*p_Var6)((CPUState_conflict *)cpu,in_stack_ffffffffffffff68);
    if ((asidx < 0) || (cpu->num_ases <= asidx)) {
      __assert_fail("ret < cpu->num_ases && ret >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                    ,0x1a5,"int cpu_asidx_from_attrs(CPUState *, MemTxAttrs)");
    }
  }
  local_48 = pCVar5[-1].tcs[0xc].gpr + 0x16;
  local_68 = (long)mmu_idx;
  local_50 = local_68 * 0x2b0;
  local_58 = (uint *)((long)pCVar5 + local_50 + -0xb10);
  local_38 = 0x1000;
  if (0x1000 < size) {
    uVar17 = *local_58;
    uVar22 = -size;
    tVar16 = vaddr;
    if (uVar17 != 0xffffffff) {
      uVar18 = uVar22 & *(uint *)((long)pCVar5 + local_50 + -0xb0c);
      do {
        uVar22 = uVar18;
        tVar16 = uVar17;
        uVar18 = uVar22 * 2;
      } while ((uVar22 & (uVar17 ^ vaddr)) != 0);
    }
    *local_58 = tVar16 & uVar22;
    *(uint *)((long)pCVar5 + local_50 + -0xb0c) = uVar22;
    local_38 = (ulong)size;
  }
  local_40 = (ulong)((uint)paddr & 0xfffff000);
  local_60 = pCVar5;
  section = address_space_translate_for_iotlb_mipsel
                      (cpu,asidx,local_40,&xlat,&local_38,attrs,&prot_local);
  if (0xfff < local_38) {
    uVar24 = vaddr & 0xfffff000;
    uVar26 = uVar24 | 0x800;
    if (0xfff < size) {
      uVar26 = uVar24;
    }
    uVar26 = (uint)attrs >> 0xc & 0x80 | uVar26;
    local_7c = attrs;
    if (section->mr->ram == true) {
      pvVar19 = memory_region_get_ram_ptr_mipsel(section->mr);
      local_78 = (long)pvVar19 + xlat;
      rVar20 = memory_region_get_ram_addr_mipsel(section->mr);
      lVar25 = rVar20 + xlat;
      local_90 = uVar26;
      if ((prot_local & 2U) != 0) {
        if (section->readonly == true) {
          local_90 = uVar26 | 0x40;
        }
        else {
          local_90 = uVar26 | 0x400;
        }
      }
    }
    else {
      hVar21 = memory_region_section_get_iotlb_mipsel(cpu,section);
      lVar25 = hVar21 + xlat;
      uVar26 = uVar26 | 0x200;
      local_78 = 0;
      local_90 = uVar26;
    }
    local_70 = (ulong)uVar24;
    uVar17 = cpu_watchpoint_address_matches_mipsel(cpu,local_70,0x1000);
    uVar22 = vaddr >> 0xc & (local_60->active_tc).gpr[local_68 * 4 + -0x14] >> 6;
    uc = (uc_struct_conflict5 *)
         ((ulong)(uVar22 << 6) + *(long *)((local_60->active_tc).gpr + local_68 * 4 + -0x12));
    ptVar1 = local_60[-1].tcs[0xc].gpr + 0xe;
    *(ushort *)ptVar1 = (ushort)*ptVar1 | (ushort)(1 << ((byte)local_68 & 0x1f));
    tlb_flush_vtlb_page_locked(local_60,(int)local_68,uVar24);
    _Var15 = tlb_hit_page_anyprot(uc,(CPUTLBEntry *)(ulong)uVar24,page);
    if ((!_Var15) &&
       (((uc->arch != 0xffffffff || (uc->mode != ~UC_MODE_ARM)) || (uc->errnum != ~UC_ERR_OK)))) {
      lVar7 = *(long *)(local_58 + 8);
      *(long *)(local_58 + 8) = lVar7 + 1;
      uVar18 = (uint)lVar7 & 7;
      uVar23 = (ulong)(uVar18 << 6);
      uVar8 = *(undefined8 *)uc;
      uVar9 = *(undefined8 *)&uc->errnum;
      pMVar10 = (uc->address_space_memory).root;
      pFVar11 = (uc->address_space_memory).current_map;
      pMVar12 = (uc->address_space_memory).listeners.tqh_first;
      pQVar13 = (uc->address_space_memory).listeners.tqh_circ.tql_prev;
      pQVar14 = (uc->address_space_memory).address_spaces_link.tqe_circ.tql_prev;
      puVar2 = (undefined8 *)((long)local_58 + uVar23 + 0x58);
      *puVar2 = (uc->address_space_memory).address_spaces_link.tqe_next;
      puVar2[1] = pQVar14;
      puVar2 = (undefined8 *)((long)local_58 + uVar23 + 0x48);
      *puVar2 = pMVar12;
      puVar2[1] = pQVar13;
      puVar2 = (undefined8 *)((long)local_58 + uVar23 + 0x38);
      *puVar2 = pMVar10;
      puVar2[1] = pFVar11;
      puVar2 = (undefined8 *)((long)local_58 + uVar23 + 0x28);
      *puVar2 = uVar8;
      puVar2[1] = uVar9;
      puVar2 = (undefined8 *)(*(long *)(local_58 + 0xaa) + (ulong)(uVar22 << 4));
      uVar8 = puVar2[1];
      puVar4 = (undefined8 *)((long)local_58 + (ulong)(uVar18 << 4) + 0x228);
      *puVar4 = *puVar2;
      puVar4[1] = uVar8;
      plVar3 = (long *)((long)local_48 + local_50 + 0x18);
      *plVar3 = *plVar3 + -1;
    }
    lVar7 = *(long *)(local_58 + 0xaa);
    *(ulong *)(lVar7 + (ulong)(uVar22 << 4)) = lVar25 - local_70;
    *(MemTxAttrs *)(lVar7 + 8 + (ulong)(uVar22 << 4)) = local_7c;
    if ((prot_local & 2U) == 0) {
      uVar24 = 0xffffffff;
    }
    else {
      uVar24 = (uVar17 & 2) << 7 | local_90 | (prot_local & 0x40U) << 5;
    }
    uc->arch = -(uint)((prot_local & 1U) == 0) | (uVar17 & 1) << 8 | uVar26;
    uc->mode = uVar24;
    uc->errnum = -(uint)((prot_local & 4U) == 0) | uVar26;
    *(int *)&uc->field_0xc = (int)local_40;
    (uc->address_space_memory).root = (MemoryRegion_conflict *)(local_78 - local_70);
    plVar3 = (long *)((long)local_48 + local_50 + 0x18);
    *plVar3 = *plVar3 + 1;
    return;
  }
  __assert_fail("sz >= TARGET_PAGE_SIZE",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                ,0x322,
                "void tlb_set_page_with_attrs_mipsel(CPUState *, target_ulong, hwaddr, MemTxAttrs, int, int, target_ulong)"
               );
}

Assistant:

void tlb_set_page_with_attrs(CPUState *cpu, target_ulong vaddr,
                             hwaddr paddr, MemTxAttrs attrs, int prot,
                             int mmu_idx, target_ulong size)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    CPUArchState *env = cpu->env_ptr;
    CPUTLB *tlb = env_tlb(env);
    CPUTLBDesc *desc = &tlb->d[mmu_idx];
    MemoryRegionSection *section;
    unsigned int index;
    target_ulong address;
    target_ulong write_address;
    uintptr_t addend;
    CPUTLBEntry *te, tn;
    hwaddr iotlb, xlat, sz, paddr_page;
    target_ulong vaddr_page;
    int asidx = cpu_asidx_from_attrs(cpu, attrs);
    int wp_flags;
    bool is_ram;

    // assert_cpu_is_self(cpu);

    if (size <= TARGET_PAGE_SIZE) {
        sz = TARGET_PAGE_SIZE;
    } else {
        tlb_add_large_page(env, mmu_idx, vaddr, size);
        sz = size;
    }
    vaddr_page = vaddr & TARGET_PAGE_MASK;
    paddr_page = paddr & TARGET_PAGE_MASK;

    section = address_space_translate_for_iotlb(cpu, asidx, paddr_page,
                                                &xlat, &sz, attrs, &prot);
    assert(sz >= TARGET_PAGE_SIZE);

    address = vaddr_page;
    if (size < TARGET_PAGE_SIZE) {
        /* Repeat the MMU check and TLB fill on every access.  */
        address |= TLB_INVALID_MASK;
    }
    if (attrs.byte_swap) {
        address |= TLB_BSWAP;
    }

    is_ram = memory_region_is_ram(section->mr);
    // is_romd = memory_region_is_romd(section->mr);

    if (is_ram) {
        /* RAM and ROMD both have associated host memory. */
        addend = (uintptr_t)memory_region_get_ram_ptr(section->mr) + xlat;
    } else {
        /* I/O does not; force the host address to NULL. */
        addend = 0;
    }

    write_address = address;
    if (is_ram) {
        iotlb = memory_region_get_ram_addr(section->mr) + xlat;
        /*
         * Computing is_clean is expensive; avoid all that unless
         * the page is actually writable.
         */
        if (prot & PAGE_WRITE) {
            if (section->readonly) {
                write_address |= TLB_DISCARD_WRITE;
            } else if (cpu_physical_memory_is_clean(iotlb)) {
                write_address |= TLB_NOTDIRTY;
            }
        }
    } else {
        /* I/O or ROMD */
        iotlb = memory_region_section_get_iotlb(cpu, section) + xlat;
        /*
         * Writes to romd devices must go through MMIO to enable write.
         * Reads to romd devices go through the ram_ptr found above,
         * but of course reads to I/O must go through MMIO.
         */
        write_address |= TLB_MMIO;
        //if (!is_romd) {
            address = write_address;
        //}
    }

    wp_flags = cpu_watchpoint_address_matches(cpu, vaddr_page,
                                              TARGET_PAGE_SIZE);

    index = tlb_index(env, mmu_idx, vaddr_page);
    te = tlb_entry(env, mmu_idx, vaddr_page);

    /* Note that the tlb is no longer clean.  */
    tlb->c.dirty |= 1 << mmu_idx;

    /* Make sure there's no cached translation for the new page.  */
    tlb_flush_vtlb_page_locked(env, mmu_idx, vaddr_page);

    /*
     * Only evict the old entry to the victim tlb if it's for a
     * different page; otherwise just overwrite the stale data.
     */
    if (!tlb_hit_page_anyprot(env->uc, te, vaddr_page) && !tlb_entry_is_empty(te)) {
        unsigned vidx = desc->vindex++ % CPU_VTLB_SIZE;
        CPUTLBEntry *tv = &desc->vtable[vidx];

        /* Evict the old entry into the victim tlb.  */
        copy_tlb_helper_locked(tv, te);
        desc->viotlb[vidx] = desc->iotlb[index];
        tlb_n_used_entries_dec(env, mmu_idx);
    }

    /* refill the tlb */
    /*
     * At this point iotlb contains a physical section number in the lower
     * TARGET_PAGE_BITS, and either
     *  + the ram_addr_t of the page base of the target RAM (RAM)
     *  + the offset within section->mr of the page base (I/O, ROMD)
     * We subtract the vaddr_page (which is page aligned and thus won't
     * disturb the low bits) to give an offset which can be added to the
     * (non-page-aligned) vaddr of the eventual memory access to get
     * the MemoryRegion offset for the access. Note that the vaddr we
     * subtract here is that of the page base, and not the same as the
     * vaddr we add back in io_readx()/io_writex()/get_page_addr_code().
     */
    desc->iotlb[index].addr = iotlb - vaddr_page;
    desc->iotlb[index].attrs = attrs;

    /* Now calculate the new entry */
    tn.addend = addend - vaddr_page;
    tn.paddr = paddr_page;
    if (prot & PAGE_READ) {
        tn.addr_read = address;
        if (wp_flags & BP_MEM_READ) {
            tn.addr_read |= TLB_WATCHPOINT;
        }
    } else {
        tn.addr_read = -1;
    }

    if (prot & PAGE_EXEC) {
        tn.addr_code = address;
    } else {
        tn.addr_code = -1;
    }

    tn.addr_write = -1;
    if (prot & PAGE_WRITE) {
        tn.addr_write = write_address;
        if (prot & PAGE_WRITE_INV) {
            tn.addr_write |= TLB_INVALID_MASK;
        }
        if (wp_flags & BP_MEM_WRITE) {
            tn.addr_write |= TLB_WATCHPOINT;
        }
    }

    copy_tlb_helper_locked(te, &tn);
    tlb_n_used_entries_inc(env, mmu_idx);
}